

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::BasicReporter::BasicReporter(BasicReporter *this,ReporterConfig *config)

{
  (this->super_SharedImpl<Catch::IReporter>).m_rc = 0;
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__BasicReporter_001d5098;
  ReporterConfig::ReporterConfig(&this->m_config,config);
  this->m_firstSectionInTestCase = true;
  (this->m_testingSpan).name._M_dataplus._M_p = (pointer)&(this->m_testingSpan).name.field_2;
  (this->m_testingSpan).name._M_string_length = 0;
  (this->m_testingSpan).name.field_2._M_local_buf[0] = '\0';
  (this->m_testingSpan).emitted = false;
  (this->m_groupSpan).name._M_dataplus._M_p = (pointer)&(this->m_groupSpan).name.field_2;
  (this->m_groupSpan).name._M_string_length = 0;
  (this->m_groupSpan).name.field_2._M_local_buf[0] = '\0';
  (this->m_groupSpan).emitted = false;
  (this->m_testSpan).name._M_dataplus._M_p = (pointer)&(this->m_testSpan).name.field_2;
  (this->m_testSpan).name._M_string_length = 0;
  (this->m_testSpan).name.field_2._M_local_buf[0] = '\0';
  (this->m_testSpan).emitted = false;
  (this->m_sectionSpans).
  super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sectionSpans).
  super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_sectionSpans).
           super__Vector_base<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

BasicReporter( const ReporterConfig& config )
        :   m_config( config ),
            m_firstSectionInTestCase( true ),
            m_aborted( false )
        {}